

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btVector3.h
# Opt level: O3

bool btRayAabb(btVector3 *rayFrom,btVector3 *rayTo,btVector3 *aabbMin,btVector3 *aabbMax,
              btScalar *param,btVector3 *normal)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  btScalar bVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined8 local_48;
  undefined8 uStack_40;
  btVector3 source;
  btVector3 aabbHalfExtent;
  btVector3 r;
  
  fVar8 = (aabbMax->m_floats[2] - aabbMin->m_floats[2]) * 0.5;
  aabbHalfExtent.m_floats[2] = (btScalar)(int)(ulong)(uint)fVar8;
  aabbHalfExtent.m_floats[3] = (btScalar)(int)((ulong)(uint)fVar8 >> 0x20);
  fVar10 = (aabbMax->m_floats[2] + aabbMin->m_floats[2]) * 0.5;
  fVar7 = rayFrom->m_floats[2] - fVar10;
  source.m_floats[2] = (btScalar)(int)(ulong)(uint)fVar7;
  source.m_floats[3] = (btScalar)(int)((ulong)(uint)fVar7 >> 0x20);
  fVar14 = (float)*(undefined8 *)aabbMin->m_floats;
  fVar16 = (float)((ulong)*(undefined8 *)aabbMin->m_floats >> 0x20);
  fVar13 = (float)*(undefined8 *)aabbMax->m_floats;
  fVar15 = (float)((ulong)*(undefined8 *)aabbMax->m_floats >> 0x20);
  aabbHalfExtent.m_floats[0] = (fVar13 - fVar14) * 0.5;
  aabbHalfExtent.m_floats[1] = (fVar15 - fVar16) * 0.5;
  fVar14 = (fVar13 + fVar14) * 0.5;
  fVar16 = (fVar15 + fVar16) * 0.5;
  fVar11 = (float)*(undefined8 *)rayFrom->m_floats - fVar14;
  fVar12 = (float)((ulong)*(undefined8 *)rayFrom->m_floats >> 0x20) - fVar16;
  source.m_floats[0] = fVar11;
  source.m_floats[1] = fVar12;
  fVar14 = (float)*(undefined8 *)rayTo->m_floats - fVar14;
  fVar16 = (float)((ulong)*(undefined8 *)rayTo->m_floats >> 0x20) - fVar16;
  bVar2 = (fVar8 < fVar7) << 5 |
          ((aabbHalfExtent.m_floats[1] < fVar12) << 4 |
          (fVar11 < -aabbHalfExtent.m_floats[0]) + (aabbHalfExtent.m_floats[0] < fVar11) * '\b' +
          (fVar12 < -aabbHalfExtent.m_floats[1]) * '\x02') + (fVar7 < -fVar8) * '\x04';
  fVar10 = rayTo->m_floats[2] - fVar10;
  bVar3 = (fVar8 < fVar10) << 5 |
          ((aabbHalfExtent.m_floats[1] < fVar16) << 4 |
          (fVar14 < -aabbHalfExtent.m_floats[0]) + (aabbHalfExtent.m_floats[0] < fVar14) * '\b' +
          (fVar16 < -aabbHalfExtent.m_floats[1]) * '\x02') + (fVar10 < -fVar8) * '\x04';
  if ((bVar2 & bVar3) == 0) {
    bVar9 = *param;
    r.m_floats[0] = fVar14 - fVar11;
    r.m_floats[1] = fVar16 - fVar12;
    r.m_floats[2] = fVar10 - fVar7;
    r.m_floats[3] = 0.0;
    local_48 = 0;
    uStack_40 = 0;
    fVar14 = 0.0;
    fVar16 = 1.0;
    bVar4 = 1;
    bVar1 = true;
    do {
      bVar5 = bVar1;
      lVar6 = 0;
      do {
        if ((bVar4 & bVar2) == 0) {
          if (((bVar4 & bVar3) != 0) &&
             (fVar7 = (-aabbHalfExtent.m_floats[lVar6] * fVar16 - source.m_floats[lVar6]) /
                      r.m_floats[lVar6], fVar7 < bVar9)) {
            bVar9 = fVar7;
          }
        }
        else {
          fVar7 = (-aabbHalfExtent.m_floats[lVar6] * fVar16 - source.m_floats[lVar6]) /
                  r.m_floats[lVar6];
          if (fVar14 <= fVar7) {
            local_48 = 0;
            uStack_40 = 0;
            *(float *)((long)&local_48 + lVar6 * 4) = fVar16;
            fVar14 = fVar7;
          }
        }
        bVar4 = bVar4 * '\x02';
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      fVar16 = -1.0;
      bVar1 = false;
    } while (bVar5);
    if (fVar14 <= bVar9) {
      *param = fVar14;
      *(undefined8 *)normal->m_floats = local_48;
      *(undefined8 *)(normal->m_floats + 2) = uStack_40;
      return true;
    }
  }
  return false;
}

Assistant:

SIMD_FORCE_INLINE btVector3
operator-(const btVector3& v1, const btVector3& v2)
{
#if defined BT_USE_SIMD_VECTOR3 && (defined(BT_USE_SSE_IN_API)  && defined(BT_USE_SSE))

	//	without _mm_and_ps this code causes slowdown in Concave moving
	__m128 r = _mm_sub_ps(v1.mVec128, v2.mVec128);
	return btVector3(_mm_and_ps(r, btvFFF0fMask));
#elif defined(BT_USE_NEON)
	float32x4_t r = vsubq_f32(v1.mVec128, v2.mVec128);
	return btVector3((float32x4_t)vandq_s32((int32x4_t)r, btvFFF0Mask));
#else
	return btVector3(
			v1.m_floats[0] - v2.m_floats[0],
			v1.m_floats[1] - v2.m_floats[1],
			v1.m_floats[2] - v2.m_floats[2]);
#endif
}